

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOptionCommand.cxx
# Opt level: O3

bool cmOptionCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  string *psVar3;
  pointer pbVar4;
  bool bVar5;
  PolicyStatus PVar6;
  int iVar7;
  CacheEntryType CVar8;
  cmValue cVar9;
  cmState *this;
  PolicyID id;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  uint uVar10;
  char *pcVar11;
  _Alloc_hider _Var12;
  ulong uVar13;
  string_view separator;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string initialValue;
  string local_f8;
  uint local_d4;
  string local_d0;
  undefined1 local_b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  string *local_88;
  size_type local_80;
  pointer local_78;
  undefined8 local_70;
  undefined8 local_68;
  char *local_60;
  undefined8 local_58;
  string local_50;
  
  uVar13 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffc0;
  if (uVar13 == 0x40) {
    uVar10 = 0;
    PVar6 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0077,false);
    cmMakefile::GetStateSnapshot(status->Makefile);
    cVar9 = cmStateSnapshot::GetDefinition
                      ((cmStateSnapshot *)local_b0,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (PVar6 - NEW < 3) {
      if (cVar9.Value != (string *)0x0) goto LAB_002755ea;
      uVar10 = 0;
    }
    else if (PVar6 == WARN) {
      local_b0._0_8_ = cVar9;
      iVar7 = cmValue::Compare((cmValue *)local_b0,(cmValue)0x0);
      uVar10 = (uint)(iVar7 != 0);
    }
    this = cmMakefile::GetState(status->Makefile);
    cVar9 = cmState::GetCacheEntryValue
                      (this,(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
    if (cVar9.Value == (string *)0x0) {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Off","");
      pcVar11 = extraout_RDX_00;
LAB_0027568e:
      local_d4 = uVar10;
      if ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start == 0x60) {
        std::__cxx11::string::_M_assign((string *)&local_f8);
        pcVar11 = extraout_RDX_01;
      }
      value._M_str = pcVar11;
      value._M_len = (size_t)local_f8._M_dataplus._M_p;
      bVar5 = cmValue::IsOn((cmValue *)local_f8._M_string_length,value);
      pcVar2 = status->Makefile;
      psVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pcVar11 = "OFF";
      if (bVar5) {
        pcVar11 = "ON";
      }
      local_b0._0_8_ = (cmState *)(local_b0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,pcVar11,pcVar11 + ((ulong)bVar5 ^ 3));
      cmMakefile::AddCacheDefinition
                (pcVar2,psVar3,(string *)local_b0,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1,BOOL,false);
      if ((cmState *)local_b0._0_8_ != (cmState *)(local_b0 + 0x10)) {
        operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
      }
      PVar6 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0077,false);
      uVar10 = local_d4;
      if ((PVar6 != NEW) &&
         (PVar6 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0126,false), PVar6 == NEW)) {
        cmMakefile::GetStateSnapshot(status->Makefile);
        cmStateSnapshot::RemoveDefinition
                  ((cmStateSnapshot *)local_b0,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
      }
      if ((char)uVar10 != '\0') {
        cmMakefile::GetStateSnapshot(status->Makefile);
        cVar9 = cmStateSnapshot::GetDefinition
                          ((cmStateSnapshot *)local_b0,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
        if (cVar9.Value == (string *)0x0) {
          pcVar2 = status->Makefile;
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_50,(cmPolicies *)0x4d,id);
          pbVar4 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_b0._0_8_ = local_50._M_string_length;
          local_b0._8_8_ = local_50._M_dataplus._M_p;
          local_b0._24_8_ = 0x59;
          local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x7bb242;
          local_88 = (string *)0x0;
          local_78 = (pbVar4->_M_dataplus)._M_p;
          local_80 = pbVar4->_M_string_length;
          local_70 = 0;
          local_68 = 2;
          local_60 = "\'.";
          local_58 = 0;
          views_00._M_len = 4;
          views_00._M_array = (iterator)local_b0;
          local_b0._16_8_ = &local_50;
          cmCatViews(&local_d0,views_00);
          cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
      }
      goto LAB_002755cf;
    }
    CVar8 = cmState::GetCacheEntryType
                      (this,(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
    if (CVar8 == UNINITIALIZED) {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      pcVar1 = ((cVar9.Value)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,pcVar1,pcVar1 + (cVar9.Value)->_M_string_length);
      pcVar11 = extraout_RDX;
      goto LAB_0027568e;
    }
    psVar3 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_b0._0_8_ = (cmState *)(local_b0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"HELPSTRING","");
    cmState::SetCacheEntryProperty
              (this,psVar3,(string *)local_b0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1);
    local_f8.field_2._M_allocated_capacity = local_b0._16_8_;
    _Var12._M_p = (pointer)local_b0._0_8_;
    if ((cmState *)local_b0._0_8_ == (cmState *)(local_b0 + 0x10)) goto LAB_002755ea;
  }
  else {
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin(&local_d0,args,separator,(string_view)ZEXT816(0));
    local_b0._0_8_ = &DAT_0000002b;
    local_b0._8_8_ = "called with incorrect number of arguments: ";
    local_b0._16_8_ = (string *)0x0;
    local_b0._24_8_ = local_d0._M_string_length;
    local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_d0._M_dataplus._M_p;
    views._M_len = 2;
    views._M_array = (iterator)local_b0;
    local_88 = &local_d0;
    cmCatViews(&local_f8,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002755cf:
    _Var12._M_p = local_f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_002755ea;
  }
  operator_delete(_Var12._M_p,
                  (ulong)((long)&(((string *)local_f8.field_2._M_allocated_capacity)->_M_dataplus).
                                 _M_p + 1));
LAB_002755ea:
  return uVar13 == 0x40;
}

Assistant:

bool cmOptionCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  const bool argError = (args.size() < 2) || (args.size() > 3);
  if (argError) {
    std::string m = cmStrCat("called with incorrect number of arguments: ",
                             cmJoin(args, " "));
    status.SetError(m);
    return false;
  }

  // Determine the state of the option policy
  bool checkAndWarn = false;
  {
    auto policyStatus =
      status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0077);
    const auto& existsBeforeSet =
      status.GetMakefile().GetStateSnapshot().GetDefinition(args[0]);
    switch (policyStatus) {
      case cmPolicies::WARN:
        checkAndWarn = (existsBeforeSet != nullptr);
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW: {
        // See if a local variable with this name already exists.
        // If so we ignore the option command.
        if (existsBeforeSet) {
          return true;
        }
      } break;
    }
  }

  // See if a cache variable with this name already exists
  // If so just make sure the doc state is correct
  cmState* state = status.GetMakefile().GetState();
  cmValue existingValue = state->GetCacheEntryValue(args[0]);
  if (existingValue &&
      (state->GetCacheEntryType(args[0]) != cmStateEnums::UNINITIALIZED)) {
    state->SetCacheEntryProperty(args[0], "HELPSTRING", args[1]);
    return true;
  }

  // Nothing in the cache so add it
  std::string initialValue = existingValue ? *existingValue : "Off";
  if (args.size() == 3) {
    initialValue = args[2];
  }
  bool init = cmIsOn(initialValue);
  status.GetMakefile().AddCacheDefinition(args[0], init ? "ON" : "OFF",
                                          args[1], cmStateEnums::BOOL);
  if (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0077) !=
        cmPolicies::NEW &&
      status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0126) ==
        cmPolicies::NEW) {
    // if there was a definition then remove it
    status.GetMakefile().GetStateSnapshot().RemoveDefinition(args[0]);
  }

  if (checkAndWarn) {
    const auto& existsAfterSet =
      status.GetMakefile().GetStateSnapshot().GetDefinition(args[0]);
    if (!existsAfterSet) {
      status.GetMakefile().IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0077),
                 "\n"
                 "For compatibility with older versions of CMake, option "
                 "is clearing the normal variable '",
                 args[0], "'."));
    }
  }
  return true;
}